

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::complex<long_double>,_1000>::TPZManVector
          (TPZManVector<std::complex<long_double>,_1000> *this,int64_t size)

{
  long lVar1;
  complex<long_double> *pcVar2;
  complex<long_double> *pcVar3;
  int64_t iVar4;
  
  TPZVec<std::complex<long_double>_>::TPZVec(&this->super_TPZVec<std::complex<long_double>_>,0);
  (this->super_TPZVec<std::complex<long_double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_017d7e20;
  lVar1 = 0x30;
  do {
    *(longdouble *)(this->fExtAlloc[0]._M_value + lVar1 + -0x30) = (longdouble)0;
    *(longdouble *)
     ((long)&(((TPZManVector<std::complex<long_double>,_1000> *)(this->fExtAlloc + -1))->
             super_TPZVec<std::complex<long_double>_>)._vptr_TPZVec + lVar1) = (longdouble)0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x7d30);
  if (size < 0x3e9) {
    pcVar2 = this->fExtAlloc;
    iVar4 = 0;
  }
  else {
    pcVar2 = (complex<long_double> *)
             operator_new__(-(ulong)((ulong)size >> 0x3b != 0) | size * 0x20);
    pcVar3 = pcVar2;
    do {
      *(longdouble *)pcVar3->_M_value = (longdouble)0;
      *(longdouble *)((long)pcVar3->_M_value + 0x10) = (longdouble)0;
      pcVar3 = pcVar3 + 1;
      iVar4 = size;
    } while (pcVar3 != pcVar2 + size);
  }
  (this->super_TPZVec<std::complex<long_double>_>).fStore = pcVar2;
  (this->super_TPZVec<std::complex<long_double>_>).fNElements = size;
  (this->super_TPZVec<std::complex<long_double>_>).fNAlloc = iVar4;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}